

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushID(char *str_id_begin,char *str_id_end)

{
  ImVector<unsigned_int> *this;
  ImGuiID local_24;
  ImGuiWindow *local_20;
  ImGuiWindow *window;
  char *str_id_end_local;
  char *str_id_begin_local;
  
  local_20 = GImGui->CurrentWindow;
  this = &local_20->IDStack;
  window = (ImGuiWindow *)str_id_end;
  str_id_end_local = str_id_begin;
  local_24 = ImGuiWindow::GetIDNoKeepAlive(local_20,str_id_begin,str_id_end);
  ImVector<unsigned_int>::push_back(this,&local_24);
  return;
}

Assistant:

void ImGui::PushID(const char* str_id_begin, const char* str_id_end)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    window->IDStack.push_back(window->GetIDNoKeepAlive(str_id_begin, str_id_end));
}